

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

RequiredError *
CLI::RequiredError::Option
          (RequiredError *__return_storage_ptr__,size_t min_option,size_t max_option,size_t used,
          string *option_list)

{
  string local_3a0;
  string local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string *local_30;
  string *option_list_local;
  size_t used_local;
  size_t max_option_local;
  size_t min_option_local;
  
  local_30 = option_list;
  option_list_local = (string *)used;
  used_local = max_option;
  max_option_local = min_option;
  min_option_local = (size_t)__return_storage_ptr__;
  if (((min_option == 1) && (max_option == 1)) && (used == 0)) {
    ::std::operator+(&local_70,"Exactly 1 option from [",option_list);
    ::std::operator+(&local_50,&local_70,"]");
    RequiredError(__return_storage_ptr__,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
  }
  else if (((min_option == 1) && (max_option == 1)) && (1 < used)) {
    ::std::operator+(&local_100,"Exactly 1 option from [",option_list);
    ::std::operator+(&local_e0,&local_100,"] is required and ");
    std::__cxx11::to_string(&local_120,(unsigned_long)option_list_local);
    ::std::operator+(&local_c0,&local_e0,&local_120);
    ::std::operator+(&local_a0,&local_c0," were given");
    RequiredError(__return_storage_ptr__,&local_a0,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&local_c0);
    ::std::__cxx11::string::~string((string *)&local_120);
    ::std::__cxx11::string::~string((string *)&local_e0);
    ::std::__cxx11::string::~string((string *)&local_100);
  }
  else if ((min_option == 1) && (used == 0)) {
    ::std::operator+(&local_160,"At least 1 option from [",option_list);
    ::std::operator+(&local_140,&local_160,"]");
    RequiredError(__return_storage_ptr__,&local_140);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string((string *)&local_160);
  }
  else if (used < min_option) {
    std::__cxx11::to_string(&local_240,min_option);
    ::std::operator+(&local_220,"Requires at least ",&local_240);
    ::std::operator+(&local_200,&local_220," options used and only ");
    std::__cxx11::to_string(&local_260,(unsigned_long)option_list_local);
    ::std::operator+(&local_1e0,&local_200,&local_260);
    ::std::operator+(&local_1c0,&local_1e0,"were given from [");
    ::std::operator+(&local_1a0,&local_1c0,local_30);
    ::std::operator+(&local_180,&local_1a0,"]");
    RequiredError(__return_storage_ptr__,&local_180,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_180);
    ::std::__cxx11::string::~string((string *)&local_1a0);
    ::std::__cxx11::string::~string((string *)&local_1c0);
    ::std::__cxx11::string::~string((string *)&local_1e0);
    ::std::__cxx11::string::~string((string *)&local_260);
    ::std::__cxx11::string::~string((string *)&local_200);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_240);
  }
  else if (max_option == 1) {
    ::std::operator+(&local_2a0,"Requires at most 1 options be given from [",option_list);
    ::std::operator+(&local_280,&local_2a0,"]");
    RequiredError(__return_storage_ptr__,&local_280,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_280);
    ::std::__cxx11::string::~string((string *)&local_2a0);
  }
  else {
    std::__cxx11::to_string(&local_380,max_option);
    ::std::operator+(&local_360,"Requires at most ",&local_380);
    ::std::operator+(&local_340,&local_360," options be used and ");
    std::__cxx11::to_string(&local_3a0,(unsigned_long)option_list_local);
    ::std::operator+(&local_320,&local_340,&local_3a0);
    ::std::operator+(&local_300,&local_320,"were given from [");
    ::std::operator+(&local_2e0,&local_300,local_30);
    ::std::operator+(&local_2c0,&local_2e0,"]");
    RequiredError(__return_storage_ptr__,&local_2c0,RequiredError);
    ::std::__cxx11::string::~string((string *)&local_2c0);
    ::std::__cxx11::string::~string((string *)&local_2e0);
    ::std::__cxx11::string::~string((string *)&local_300);
    ::std::__cxx11::string::~string((string *)&local_320);
    ::std::__cxx11::string::~string((string *)&local_3a0);
    ::std::__cxx11::string::~string((string *)&local_340);
    ::std::__cxx11::string::~string((string *)&local_360);
    ::std::__cxx11::string::~string((string *)&local_380);
  }
  return __return_storage_ptr__;
}

Assistant:

static RequiredError
    Option(std::size_t min_option, std::size_t max_option, std::size_t used, const std::string &option_list) {
        if((min_option == 1) && (max_option == 1) && (used == 0))
            return RequiredError("Exactly 1 option from [" + option_list + "]");
        if((min_option == 1) && (max_option == 1) && (used > 1)) {
            return RequiredError("Exactly 1 option from [" + option_list + "] is required and " + std::to_string(used) +
                                     " were given",
                                 ExitCodes::RequiredError);
        }
        if((min_option == 1) && (used == 0))
            return RequiredError("At least 1 option from [" + option_list + "]");
        if(used < min_option) {
            return RequiredError("Requires at least " + std::to_string(min_option) + " options used and only " +
                                     std::to_string(used) + "were given from [" + option_list + "]",
                                 ExitCodes::RequiredError);
        }
        if(max_option == 1)
            return RequiredError("Requires at most 1 options be given from [" + option_list + "]",
                                 ExitCodes::RequiredError);

        return RequiredError("Requires at most " + std::to_string(max_option) + " options be used and " +
                                 std::to_string(used) + "were given from [" + option_list + "]",
                             ExitCodes::RequiredError);
    }